

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::ParseableFunctionInfo::CopyNestedArray(ParseableFunctionInfo *this,ParseableFunctionInfo *other)

{
  NestedArray *pNVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  NestedArray *this_00;
  uint i;
  ulong uVar5;
  NestedArray *other_00;
  
  pNVar1 = (this->nestedArray).ptr;
  this_00 = (other->nestedArray).ptr;
  if (pNVar1 == (NestedArray *)0x0) {
    if (this_00 != (NestedArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x629,"(otherNestedArray == nullptr)",
                                  "otherNestedArray == nullptr");
      if (!bVar3) goto LAB_006c8903;
      *puVar4 = 0;
    }
  }
  else {
    if (this_00->nestedCount != pNVar1->nestedCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x62c,
                                  "(otherNestedArray->nestedCount == thisNestedArray->nestedCount)",
                                  "otherNestedArray->nestedCount == thisNestedArray->nestedCount");
      if (!bVar3) {
LAB_006c8903:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    uVar5 = 0;
    other_00 = pNVar1;
    while( true ) {
      other_00 = other_00 + 1;
      this_00 = this_00 + 1;
      if (pNVar1->nestedCount <= uVar5) break;
      Memory::WriteBarrierPtr<Js::FunctionInfo>::operator=
                ((WriteBarrierPtr<Js::FunctionInfo> *)this_00,
                 (WriteBarrierPtr<Js::FunctionInfo> *)other_00);
      uVar5 = uVar5 + 1;
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::CopyNestedArray(ParseableFunctionInfo * other)
    {
        NestedArray * thisNestedArray = this->GetNestedArray();
        NestedArray * otherNestedArray = other->GetNestedArray();
        if (thisNestedArray == nullptr)
        {
            Assert(otherNestedArray == nullptr);
            return;
        }
        Assert(otherNestedArray->nestedCount == thisNestedArray->nestedCount);

        for (uint i = 0; i < thisNestedArray->nestedCount; i++)
        {
            otherNestedArray->functionInfoArray[i] = thisNestedArray->functionInfoArray[i];
        }
    }